

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void __thiscall CServer::RegisterCommands(CServer *this)

{
  IConsole *pIVar1;
  
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[8])
            (this->m_pConsole,"kick","i[id] ?r[reason]",4,ConKick,this,
             "Kick player with specified id for any reason");
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[8])
            (this->m_pConsole,"status","",4,ConStatus,this,"List players");
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[8])
            (this->m_pConsole,"shutdown","?r[reason]",4,ConShutdown,this,"Shut down");
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[8])
            (this->m_pConsole,"logout","",0x44,ConLogout,this,"Logout of rcon");
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[8])
            (this->m_pConsole,"record","?s[file]",0xc,ConRecord,this,"Record to a file");
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[8])
            (this->m_pConsole,"stoprecord","",4,ConStopRecord,this,"Stop recording");
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[8])
            (this->m_pConsole,"reload","",4,ConMapReload,this,"Reload the map");
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0xf])
            (this->m_pConsole,"sv_name",ConchainSpecialInfoupdate,this);
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0xf])
            (this->m_pConsole,"password",ConchainSpecialInfoupdate,this);
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0xf])
            (this->m_pConsole,"sv_player_slots",ConchainPlayerSlotsUpdate,this);
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0xf])
            (this->m_pConsole,"sv_max_clients",ConchainMaxclientsUpdate,this);
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0xf])
            (this->m_pConsole,"sv_max_clients",ConchainSpecialInfoupdate,this);
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0xf])
            (this->m_pConsole,"sv_max_clients_per_ip",ConchainMaxclientsperipUpdate,this);
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0xf])
            (this->m_pConsole,"mod_command",ConchainModCommandUpdate,this);
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0xf])
            (this->m_pConsole,"console_output_level",ConchainConsoleOutputLevelUpdate,this);
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0xf])
            (this->m_pConsole,"sv_rcon_password",ConchainRconPasswordSet,this);
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0xf])
            (this->m_pConsole,"sv_map",ConchainMapUpdate,this);
  CNetBan::Init(&(this->m_ServerBan).super_CNetBan,this->m_pConsole,this->m_pStorage);
  (this->m_ServerBan).m_pServer = this;
  pIVar1 = (this->m_ServerBan).super_CNetBan.m_pConsole;
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"ban","s[id|ip|range] ?i[minutes] r[reason]",0xc,CServerBan::ConBanExt,
             &this->m_ServerBan,"Ban player with IP/IP range/client id for x minutes for any reason"
            );
  CDemoRecorder::Init(&this->m_DemoRecorder,this->m_pConsole,this->m_pStorage);
  (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[3])();
  return;
}

Assistant:

void CServer::RegisterCommands()
{
	// register console commands
	Console()->Register("kick", "i[id] ?r[reason]", CFGFLAG_SERVER, ConKick, this, "Kick player with specified id for any reason");
	Console()->Register("status", "", CFGFLAG_SERVER, ConStatus, this, "List players");
	Console()->Register("shutdown", "?r[reason]", CFGFLAG_SERVER, ConShutdown, this, "Shut down");
	Console()->Register("logout", "", CFGFLAG_SERVER|CFGFLAG_BASICACCESS, ConLogout, this, "Logout of rcon");

	Console()->Register("record", "?s[file]", CFGFLAG_SERVER|CFGFLAG_STORE, ConRecord, this, "Record to a file");
	Console()->Register("stoprecord", "", CFGFLAG_SERVER, ConStopRecord, this, "Stop recording");

	Console()->Register("reload", "", CFGFLAG_SERVER, ConMapReload, this, "Reload the map");

	Console()->Chain("sv_name", ConchainSpecialInfoupdate, this);
	Console()->Chain("password", ConchainSpecialInfoupdate, this);

	Console()->Chain("sv_player_slots", ConchainPlayerSlotsUpdate, this);
	Console()->Chain("sv_max_clients", ConchainMaxclientsUpdate, this);
	Console()->Chain("sv_max_clients", ConchainSpecialInfoupdate, this);
	Console()->Chain("sv_max_clients_per_ip", ConchainMaxclientsperipUpdate, this);
	Console()->Chain("mod_command", ConchainModCommandUpdate, this);
	Console()->Chain("console_output_level", ConchainConsoleOutputLevelUpdate, this);
	Console()->Chain("sv_rcon_password", ConchainRconPasswordSet, this);
	Console()->Chain("sv_map", ConchainMapUpdate, this);

	// register console commands in sub parts
	m_ServerBan.InitServerBan(Console(), Storage(), this);
	m_DemoRecorder.Init(Console(), Storage());
	m_pGameServer->OnConsoleInit();
}